

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

LE_EulerAngles * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator+
          (LE_EulerAngles *__return_storage_ptr__,LE_EulerAngles *this,LE_EulerAngles *Value)

{
  KFIXED<char,_(unsigned_char)__x03_> local_c8;
  KFIXED<char,_(unsigned_char)__x03_> local_b8;
  KFIXED<char,_(unsigned_char)__x03_> local_a8;
  KFIXED<char,_(unsigned_char)__x03_> local_98;
  KFIXED<char,_(unsigned_char)__x03_> local_88;
  KFIXED<char,_(unsigned_char)__x03_> local_78 [2];
  KFIXED<char,_(unsigned_char)__x03_> local_58;
  KFIXED<char,_(unsigned_char)__x03_> local_48;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  undefined1 local_21;
  LE_EulerAngles *local_20;
  LE_EulerAngles *Value_local;
  LE_EulerAngles *this_local;
  LE_EulerAngles *tmp;
  
  local_21 = 0;
  local_20 = Value;
  Value_local = this;
  this_local = __return_storage_ptr__;
  LE_EulerAngles(__return_storage_ptr__,this);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_58,&local_20->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator+(&local_48,&__return_storage_ptr__->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_38,&__return_storage_ptr__->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_48);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_58);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_98,&local_20->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::operator+(&local_88,&__return_storage_ptr__->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(local_78,&__return_storage_ptr__->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(local_78);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_88);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_98);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_c8,&local_20->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator+(&local_b8,&__return_storage_ptr__->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_a8,&__return_storage_ptr__->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_a8);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_b8);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

LE_EulerAngles LE_EulerAngles::operator+( const LE_EulerAngles & Value ) const
{
    LE_EulerAngles tmp = *this;
    tmp.m_Psi   = tmp.m_Psi + Value.m_Psi;
    tmp.m_Theta = tmp.m_Theta + Value.m_Theta;
    tmp.m_Phi   = tmp.m_Phi + Value.m_Phi;
    return tmp;
}